

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

int coda_strnappend(string *out,size_t num,char *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  char *in_RDX;
  ulong in_RSI;
  char *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *BUF_1;
  char BUF [32768];
  int bytes;
  va_list ap;
  undefined1 local_8108 [24];
  undefined8 local_80f0;
  undefined8 local_80e8;
  undefined8 local_80e0;
  undefined8 local_80d8;
  undefined8 local_80c8;
  undefined8 local_80b8;
  undefined8 local_80a8;
  undefined8 local_8098;
  undefined8 local_8088;
  undefined8 local_8078;
  undefined8 local_8068;
  char *local_8050;
  char local_8048 [32780];
  int local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined1 *local_30;
  undefined1 *local_28;
  char *local_18;
  ulong local_10;
  char *local_8;
  
  if (in_AL != '\0') {
    local_80d8 = in_XMM0_Qa;
    local_80c8 = in_XMM1_Qa;
    local_80b8 = in_XMM2_Qa;
    local_80a8 = in_XMM3_Qa;
    local_8098 = in_XMM4_Qa;
    local_8088 = in_XMM5_Qa;
    local_8078 = in_XMM6_Qa;
    local_8068 = in_XMM7_Qa;
  }
  local_28 = local_8108;
  local_30 = &stack0x00000008;
  local_34 = 0x30;
  local_38 = 0x18;
  local_80f0 = in_RCX;
  local_80e8 = in_R8;
  local_80e0 = in_R9;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (in_RSI < 0x8000) {
    local_3c = vsnprintf(local_8048,in_RSI + 1,in_RDX,&local_38);
    if ((int)in_RSI < local_3c) {
      local_3c = (int)local_10;
    }
    std::__cxx11::string::append(local_8,(ulong)local_8048);
  }
  else {
    local_8050 = (char *)operator_new__(in_RSI + 1);
    iVar1 = (int)local_10;
    local_3c = vsnprintf(local_8050,local_10 + 1,local_18,&local_38);
    if (iVar1 < local_3c) {
      local_3c = (int)local_10;
    }
    std::__cxx11::string::append(local_8,(ulong)local_8050);
    if (local_8050 != (char *)0x0) {
      operator_delete__(local_8050);
    }
  }
  return local_3c;
}

Assistant:

int coda_strnappend(std::string& out, size_t num, const char* fmt, ...)
{
	va_list ap;
	va_start(ap, fmt);

	int bytes;

	if (num < BUFSZ)
	{
		char BUF [BUFSZ];

		if ((int) num < (bytes = vsnprintf(BUF, num + 1, fmt, ap)))
		{
			bytes = num;
		}

		out.append(BUF, bytes);
	}
	else
	{
		char* BUF = new char [num + 1];

		if ((int) num < (bytes = vsnprintf(BUF, num + 1, fmt, ap)))
		{
			bytes = num;
		}

		out.append(BUF, bytes);

		delete [] BUF;
	}

	va_end(ap);

	return bytes;
}